

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O0

ParseNodeCall * __thiscall
Parser::CreateCallNode
          (Parser *this,OpCode nop,ParseNodePtr pnode1,ParseNodePtr pnode2,charcount_t ichMin,
          charcount_t ichLim)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *alloc;
  ParseNodeCall *this_00;
  TrackAllocData local_60;
  ParseNodeCall *local_38;
  ParseNodeCall *pnode;
  charcount_t ichLim_local;
  charcount_t ichMin_local;
  ParseNodePtr pnode2_local;
  ParseNodePtr pnode1_local;
  Parser *pPStack_10;
  OpCode nop_local;
  Parser *this_local;
  
  pnode._0_4_ = ichLim;
  pnode._4_4_ = ichMin;
  _ichLim_local = pnode2;
  pnode2_local = pnode1;
  pnode1_local._7_1_ = nop;
  pPStack_10 = this;
  if (this->m_deferringAST != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0x491,"(!this->m_deferringAST)","!this->m_deferringAST");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  VerifyNodeSize(pnode1_local._7_1_,0x28);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_60,(type_info *)&ParseNodeCall::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
             ,0x497);
  alloc = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::TrackAllocInfo
                    ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)this,
                     &local_60);
  this_00 = (ParseNodeCall *)new<Memory::ArenaAllocator>(0x28,(ArenaAllocator *)alloc,0x3f67b0);
  ParseNodeCall::ParseNodeCall
            (this_00,pnode1_local._7_1_,pnode._4_4_,(charcount_t)pnode,pnode2_local,_ichLim_local);
  local_38 = this_00;
  AddAstSize(this,0x28);
  return local_38;
}

Assistant:

ParseNodeCall * Parser::CreateCallNode(OpCode nop, ParseNodePtr pnode1, ParseNodePtr pnode2, charcount_t ichMin, charcount_t ichLim)
{
    Assert(!this->m_deferringAST);

    // Classes, derived from ParseNodeCall, can be created here as well,
    // as long as their size matches kcbPnCall (that is, they don't add
    // any data members of their own).
    DebugOnly(VerifyNodeSize(nop, sizeof(ParseNodeCall)));
    ParseNodeCall* pnode = Anew(&m_nodeAllocator, ParseNodeCall, nop, ichMin, ichLim, pnode1, pnode2);
    AddAstSize(sizeof(ParseNodeCall));

    return pnode;
}